

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CThreadSuspensionInfo::InternalSuspendNewThreadFromData
          (CThreadSuspensionInfo *this,CPalThread *pThread)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  CThreadSuspensionInfo *this_00;
  PAL_ERROR PVar4;
  PAL_ERROR PVar5;
  uint local_34;
  int local_30;
  int pipe_descs [2];
  BYTE resume_code;
  
  AcquireSuspensionLock(this,pThread);
  (pThread->suspensionInfo).m_fSelfsusp = 1;
  ReleaseSuspensionLock(this,pThread);
  iVar1 = pipe((int *)&local_34);
  if (iVar1 == -1) {
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    piVar3 = __errno_location();
    strerror(*piVar3);
    PVar5 = 8;
  }
  else {
    (pThread->suspensionInfo).m_nBlockingPipe = local_30;
    CPalThread::SetStartStatus(pThread,true);
    pipe_descs[0]._3_1_ = '\0';
    PVar4 = 0x54f;
    while( true ) {
      this_00 = (CThreadSuspensionInfo *)(ulong)local_34;
      sVar2 = read(local_34,(void *)((long)pipe_descs + 3),1);
      if (sVar2 == 1) break;
      if ((sVar2 != -1) || (piVar3 = __errno_location(), *piVar3 != 4)) goto LAB_00144201;
    }
    PVar4 = 0;
LAB_00144201:
    PVar5 = 0x54f;
    if (pipe_descs[0]._3_1_ == '*') {
      PVar5 = PVar4;
    }
    if (sVar2 != 1) {
      PVar5 = PVar4;
    }
    if (PVar5 == 0) {
      AcquireSuspensionLock(this_00,pThread);
      (pThread->suspensionInfo).m_fSelfsusp = 0;
      ReleaseSuspensionLock(this_00,pThread);
    }
    close(local_34);
    close(local_30);
  }
  return PVar5;
}

Assistant:

PAL_ERROR
CThreadSuspensionInfo::InternalSuspendNewThreadFromData(
    CPalThread *pThread
    )
{
    PAL_ERROR palError = NO_ERROR;

    AcquireSuspensionLock(pThread);
    pThread->suspensionInfo.SetSelfSusp(TRUE);
    ReleaseSuspensionLock(pThread);

    int pipe_descs[2];
    if (pipe(pipe_descs) == -1)
    {
        ERROR("pipe() failed! error is %d (%s)\n", errno, strerror(errno));
        return ERROR_NOT_ENOUGH_MEMORY;
    }

    // [0] is the read end of the pipe, and [1] is the write end.
    pThread->suspensionInfo.SetBlockingPipe(pipe_descs[1]);
    pThread->SetStartStatus(TRUE);

    BYTE resume_code = 0;
    ssize_t read_ret;

    // Block until ResumeThread writes something to the pipe
    while ((read_ret = read(pipe_descs[0], &resume_code, sizeof(resume_code))) != sizeof(resume_code))
    {
        if (read_ret != -1 || EINTR != errno)
        {
            // read might return 0 (with EAGAIN) if the other end of the pipe gets closed
            palError = ERROR_INTERNAL_ERROR;
            break;
        }
    }

    if (palError == NO_ERROR && resume_code != WAKEUPCODE)
    {
        // If we did read successfully but the byte didn't match WAKEUPCODE, we treat it as a failure.
        palError = ERROR_INTERNAL_ERROR;
    }

    if (palError == NO_ERROR)
    {
        AcquireSuspensionLock(pThread);
        pThread->suspensionInfo.SetSelfSusp(FALSE);
        ReleaseSuspensionLock(pThread);
    }

    // Close the pipes regardless of whether we were successful.
    close(pipe_descs[0]);
    close(pipe_descs[1]);

    return palError;
}